

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void __thiscall
duckdb::RLECompressState<long,_true>::Append
          (RLECompressState<long,_true> *this,UnifiedVectorFormat *vdata,idx_t count)

{
  long *data;
  sel_t *psVar1;
  idx_t idx;
  idx_t iVar2;
  
  if (count != 0) {
    data = (long *)vdata->data;
    iVar2 = 0;
    do {
      psVar1 = vdata->sel->sel_vector;
      idx = iVar2;
      if (psVar1 != (sel_t *)0x0) {
        idx = (idx_t)psVar1[iVar2];
      }
      RLEState<long>::Update<duckdb::RLECompressState<long,true>::RLEWriter>
                (&this->state,data,&vdata->validity,idx);
      iVar2 = iVar2 + 1;
    } while (count != iVar2);
  }
  return;
}

Assistant:

void Append(UnifiedVectorFormat &vdata, idx_t count) {
		auto data = UnifiedVectorFormat::GetData<T>(vdata);
		for (idx_t i = 0; i < count; i++) {
			auto idx = vdata.sel->get_index(i);
			state.template Update<RLECompressState<T, WRITE_STATISTICS>::RLEWriter>(data, vdata.validity, idx);
		}
	}